

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  int iVar1;
  int iVar2;
  EnumGenerator *this_00;
  EnumDescriptor *descriptor;
  MessageGenerator *this_01;
  Descriptor *descriptor_00;
  ExtensionGenerator *this_02;
  FieldDescriptor *descriptor_01;
  ExtensionGenerator *local_58;
  ExtensionGenerator *generator_2;
  MessageGenerator *pMStack_48;
  int i_2;
  MessageGenerator *generator_1;
  EnumGenerator *pEStack_38;
  int i_1;
  EnumGenerator *generator;
  int i;
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  this->file_ = file;
  local_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  FileClassName_abi_cxx11_(&this->root_class_name_,(objectivec *)file,(FileDescriptor *)options);
  std::
  vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ::vector(&this->enum_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ::vector(&this->message_generators_);
  std::
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ::vector(&this->extension_generators_);
  Options::Options(&this->options_,local_20);
  generator._0_4_ = 0;
  while( true ) {
    iVar1 = (int)generator;
    iVar2 = FileDescriptor::enum_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    this_00 = (EnumGenerator *)operator_new(0x58);
    descriptor = FileDescriptor::enum_type(this->file_,(int)generator);
    EnumGenerator::EnumGenerator(this_00,descriptor);
    pEStack_38 = this_00;
    std::
    vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
    ::push_back(&this->enum_generators_,&stack0xffffffffffffffc8);
    generator._0_4_ = (int)generator + 1;
  }
  generator_1._4_4_ = 0;
  while( true ) {
    iVar1 = generator_1._4_4_;
    iVar2 = FileDescriptor::message_type_count(this->file_);
    if (iVar2 <= iVar1) break;
    this_01 = (MessageGenerator *)operator_new(0xe0);
    descriptor_00 = FileDescriptor::message_type(this->file_,generator_1._4_4_);
    MessageGenerator::MessageGenerator
              (this_01,&this->root_class_name_,descriptor_00,&this->options_);
    pMStack_48 = this_01;
    std::
    vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
    ::push_back(&this->message_generators_,&stack0xffffffffffffffb8);
    generator_1._4_4_ = generator_1._4_4_ + 1;
  }
  generator_2._4_4_ = 0;
  while( true ) {
    iVar1 = generator_2._4_4_;
    iVar2 = FileDescriptor::extension_count(this->file_);
    if (iVar2 <= iVar1) break;
    this_02 = (ExtensionGenerator *)operator_new(0x48);
    descriptor_01 = FileDescriptor::extension(this->file_,generator_2._4_4_);
    ExtensionGenerator::ExtensionGenerator(this_02,&this->root_class_name_,descriptor_01);
    local_58 = this_02;
    std::
    vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
    ::push_back(&this->extension_generators_,&local_58);
    generator_2._4_4_ = generator_2._4_4_ + 1;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor *file, const Options& options)
    : file_(file),
      root_class_name_(FileClassName(file)),
      options_(options) {
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator *generator = new EnumGenerator(file_->enum_type(i));
    enum_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    MessageGenerator *generator =
        new MessageGenerator(root_class_name_, file_->message_type(i), options_);
    message_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator *generator =
        new ExtensionGenerator(root_class_name_, file_->extension(i));
    extension_generators_.push_back(generator);
  }
}